

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> * __thiscall
SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
          (SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *this,
          SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits)

{
  if (bits.m_int < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17b3,
                  "SafeInt<T, E> &SafeInt<int>::operator>>=(SafeInt<U, E>) [T = int, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = int]"
                 );
  }
  if ((uint)bits.m_int < 0x20) {
    *(int *)this = *(int *)this >> ((byte)bits.m_int & 0x1f);
    return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
           this;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17b4,
                "SafeInt<T, E> &SafeInt<int>::operator>>=(SafeInt<U, E>) [T = int, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = int]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= (U)bits;
        return *this;
    }